

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

bool __thiscall xmrig::Config::isShouldSave(Config *this)

{
  bool bVar1;
  OclConfig *this_00;
  CudaConfig *this_01;
  CpuConfig *this_02;
  Config *in_RDI;
  bool local_19;
  bool local_1;
  
  bVar1 = BaseConfig::isAutoSave(&in_RDI->super_BaseConfig);
  if (bVar1) {
    this_00 = cl(in_RDI);
    bVar1 = OclConfig::isShouldSave(this_00);
    if (bVar1) {
      local_1 = true;
    }
    else {
      this_01 = cuda(in_RDI);
      bVar1 = CudaConfig::isShouldSave(this_01);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_19 = true;
        if (((in_RDI->super_BaseConfig).m_upgrade & 1U) == 0) {
          this_02 = cpu(in_RDI);
          local_19 = CpuConfig::isShouldSave(this_02);
        }
        local_1 = local_19;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool xmrig::Config::isShouldSave() const
{
    if (!isAutoSave()) {
        return false;
    }

#   ifdef XMRIG_FEATURE_OPENCL
    if (cl().isShouldSave()) {
        return true;
    }
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    if (cuda().isShouldSave()) {
        return true;
    }
#   endif

    return (m_upgrade || cpu().isShouldSave());
}